

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  FILE *tmp;
  int tries;
  char *trunc_mode;
  char *mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe94;
  byte in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  filename_t *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  filename_t *path;
  filename_t local_118 [3];
  allocator<char> local_b1 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_89;
  FILE *local_68;
  filename_t local_50;
  int local_2c;
  char *local_28;
  char *local_20;
  byte local_11;
  string *local_10;
  file_helper *local_8;
  undefined7 extraout_var;
  
  local_11 = (byte)__oflag & 1;
  local_10 = (string *)__file;
  local_8 = this;
  close(this,(int)__file);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  local_20 = "ab";
  local_28 = "wb";
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x6f2756);
  if (bVar1) {
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)CONCAT17(in_stack_fffffffffffffe97,
                             CONCAT16(in_stack_fffffffffffffe96,
                                      CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
                            ),in_stack_fffffffffffffe88);
  }
  local_2c = 0;
  do {
    if (this->open_tries_ <= local_2c) {
      details::os::filename_to_str(local_118);
      std::operator+((char *)in_stack_fffffffffffffe98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      )));
      std::operator+(in_stack_fffffffffffffe98,
                     (char *)CONCAT17(in_stack_fffffffffffffe97,
                                      CONCAT16(in_stack_fffffffffffffe96,
                                               CONCAT24(in_stack_fffffffffffffe94,
                                                        in_stack_fffffffffffffe90))));
      iVar2 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      __errno_location();
      throw_spdlog_ex(in_stack_fffffffffffffea0,iVar2);
    }
    path = &local_50;
    details::os::dir_name(in_stack_fffffffffffffe98);
    details::os::create_dir(path);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
    if ((local_11 & 1) == 0) {
LAB_006f28db:
      in_stack_fffffffffffffe98 = (filename_t *)&this->fd_;
      in_stack_fffffffffffffea0 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (allocator<char> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffe97 =
           details::os::fopen_s
                     ((FILE **)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      (filename_t *)
                      CONCAT17(in_stack_fffffffffffffe97,
                               CONCAT16(in_stack_fffffffffffffe96,
                                        CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ))));
      in_stack_fffffffffffffe96 = in_stack_fffffffffffffe97 ^ 0xff;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT17(in_stack_fffffffffffffe97,
                           CONCAT16(in_stack_fffffffffffffe97,
                                    CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)))
                 ^ 0xff000000000000));
      std::allocator<char>::~allocator(local_b1);
      if ((in_stack_fffffffffffffe96 & 1) != 0) {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
                            *)0x6f298e);
        iVar2 = (int)CONCAT71(extraout_var,bVar1);
        if (bVar1) {
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
          ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
                        *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (_IO_FILE *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,
                                         CONCAT24(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90))));
          iVar2 = extraout_EAX;
        }
        return iVar2;
      }
      details::os::sleep_for_millis
                (CONCAT13(in_stack_fffffffffffffe97,
                          CONCAT12(in_stack_fffffffffffffe96,in_stack_fffffffffffffe94)));
    }
    else {
      in_stack_fffffffffffffed0 = &local_89;
      in_stack_fffffffffffffec0 = local_10;
      in_stack_fffffffffffffec8 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (allocator<char> *)in_stack_fffffffffffffec0);
      bVar1 = details::os::fopen_s
                        ((FILE **)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         (filename_t *)
                         CONCAT17(in_stack_fffffffffffffe97,
                                  CONCAT16(in_stack_fffffffffffffe96,
                                           CONCAT24(in_stack_fffffffffffffe94,
                                                    in_stack_fffffffffffffe90))));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if (!bVar1) {
        fclose(local_68);
        goto LAB_006f28db;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate) {
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open) {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries) {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate) {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode)) {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode)) {
            if (event_handlers_.after_open) {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing",
                    errno);
}